

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_impls.cxx
# Opt level: O3

void __thiscall
dummy_state_machine::commit
          (dummy_state_machine *this,ulong param_1,buffer *data,uptr<log_entry_cookie> *param_3)

{
  byte *__s;
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"commit message:",0xf);
  __s = cornerstone::buffer::data(data);
  if (__s == (byte *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x17a4a0);
  }
  else {
    sVar1 = strlen((char *)__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  return;
}

Assistant:

virtual void commit(const ulong, buffer& data, const uptr<log_entry_cookie>&)
    {
        std::cout << "commit message:" << reinterpret_cast<const char*>(data.data()) << std::endl;
    }